

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_duplicate.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e1;
  allocator_type local_b9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined8 local_2c;
  undefined4 local_24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400000003;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x400000001;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_20,__l,(allocator_type *)&local_b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,&local_20);
  iVar1 = find_duplicate(&local_48);
  if (iVar1 != 4) {
    __assert_fail("find_duplicate(e1) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/array_duplicate.cpp"
                  ,0x15,"int main()");
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000001;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x400000003;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x100000005;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,__l_00,(allocator_type *)&local_2c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,&local_98);
  iVar1 = find_duplicate(&local_60);
  if (iVar1 == 1) {
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_2c = 0x200000001;
    local_24 = 3;
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)&local_2c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8,__l_01,&local_b9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,&local_b8);
    iVar1 = find_duplicate(&local_78);
    if (iVar1 == -1) {
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
    __assert_fail("find_duplicate(e3) == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/array_duplicate.cpp"
                  ,0x1b,"int main()");
  }
  __assert_fail("find_duplicate(e2) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/lukasmartinelli[P]sharpen/challenges/array/array_duplicate.cpp"
                ,0x18,"int main()");
}

Assistant:

int main() {
    std::vector<uint32_t> e1 = {3, 4, 1, 4, 5};
    assert(find_duplicate(e1) == 4);

    std::vector<uint32_t> e2 = {1, 2, 3, 4, 5, 1};
    assert(find_duplicate(e2) == 1);

    std::vector<uint32_t> e3 = {1, 2, 3};
    assert(find_duplicate(e3) == -1);
}